

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O1

Data * __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::NewSingleChunk
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t *pBufLengthRequested)

{
  char *pcVar1;
  ulong uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Data *pDVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (0x7ffffffe < *pBufLengthRequested) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x4d,"(*pBufLengthRequested <= MaxLength)",
                                "*pBufLengthRequested <= MaxLength");
    if (!bVar4) goto LAB_00763757;
    *puVar6 = 0;
  }
  if (0x7ffffffe < *pBufLengthRequested) {
    ::Math::DefaultOverflowPolicy();
  }
  uVar9 = (ulong)(*pBufLengthRequested * 2 + 2) + 0xf;
  uVar2 = (uVar9 >> 4) * 8 - 1;
  if (uVar2 >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x59,"(newLength == size_t_newLength)",
                                "newLength == size_t_newLength");
    if (!bVar4) goto LAB_00763757;
    *puVar6 = 0;
  }
  uVar10 = (uint)uVar2;
  if ((int)uVar10 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x5a,"(newLength <= MaxLength + 1)","newLength <= MaxLength + 1");
    if (!bVar4) goto LAB_00763757;
    *puVar6 = 0;
  }
  uVar8 = 0x7ffffffe;
  if ((int)uVar10 < 0x7ffffffe) {
    uVar8 = uVar10;
  }
  if (0x7ffffffe < uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x61,"(newLength <= MaxLength)","newLength <= MaxLength");
    if (!bVar4) goto LAB_00763757;
    *puVar6 = 0;
  }
  this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00763757;
    *puVar6 = 0;
  }
  pDVar7 = (Data *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(this_00,(uVar9 & 0xfffffffffffffff0) + 0x10);
  if (pDVar7 == (Data *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_00763757:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pcVar1 = (char *)((long)&pDVar7->u + (ulong)uVar8 * 2);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  *pBufLengthRequested = uVar8;
  return pDVar7;
}

Assistant:

Data *NewSingleChunk(charcount_t *pBufLengthRequested)
        {
            Assert(*pBufLengthRequested <= MaxLength);

            // Let's just grow the current chunk in place

            CompileAssert(sizeof(charcount_t) == sizeof(uint32));

            //// allocation = (bufLengthRequested+1) * sizeof(char16)
            charcount_t alloc32 = UInt32Math::AddMul< 1, sizeof(char16) >(*pBufLengthRequested);

            size_t allocation = HeapInfo::GetAlignedSize(alloc32);
            size_t size_t_newLength  = allocation / sizeof(char16) - 1;
            charcount_t newLength = (charcount_t)size_t_newLength;
            Assert(newLength == size_t_newLength);
            Assert(newLength <= MaxLength + 1);
            if (newLength == MaxLength + 1)
            {
                // newLength could be MaxLength + 1 because of alignment.
                // In this case alloc size is 2 elements more than newLength (normally 1 elements more for NULL), that's fine.
                newLength = MaxLength;
            }
            Assert(newLength <= MaxLength);

            Data* newChunk = AllocatorNewStructPlus(TAllocator, this->alloc, allocation, Data);
            newChunk->u.single.buffer[newLength] = _u('\0');

            *pBufLengthRequested = newLength;
            return newChunk;
        }